

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int backtrack_loop(saucy *s)

{
  int *piVar1;
  int *piVar2;
  saucy_stats *psVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int *piVar14;
  int start;
  long lVar15;
  double dVar16;
  
  do {
    iVar11 = s->lev + -1;
    s->lev = iVar11;
    if (iVar11 == 0) {
      return -1;
    }
    rewind_coloring(s,&s->right,iVar11);
    uVar8 = (ulong)s->lev;
    s->nsplits = s->splitlev[uVar8];
    lVar10 = (long)s->ndiffs;
    while( true ) {
      iVar11 = (int)uVar8;
      if (lVar10 <= s->difflev[iVar11]) break;
      lVar15 = lVar10 + -1;
      lVar10 = lVar10 + -1;
      s->diffmark[s->diffs[lVar15]] = '\0';
      uVar8 = (ulong)(uint)s->lev;
    }
    s->ndiffs = s->difflev[iVar11];
    s->nundiffs = s->undifflev[iVar11];
    iVar12 = s->anc;
    if (iVar11 < iVar12) {
      piVar1 = s->start;
      lVar10 = (long)piVar1[iVar11];
      piVar9 = (s->left).lab;
      iVar12 = (s->right).clen[lVar10];
      s->anc = iVar11;
      s->indmin = piVar9[iVar12 + lVar10];
      s->match = 1;
      piVar9 = s->splitlev;
      lVar10 = (long)piVar9[(long)iVar11 + 1];
      while (piVar9[(int)uVar8] < lVar10) {
        lVar10 = lVar10 + -1;
        iVar11 = s->splitfrom[lVar10];
        iVar12 = s->threp[iVar11];
        iVar6 = s->threp[s->splitwho[lVar10]];
        uVar8 = (ulong)iVar6;
        piVar14 = s->thnext;
        piVar2 = s->thprev;
        piVar14[piVar2[iVar12]] = iVar6;
        piVar14[piVar2[uVar8]] = iVar12;
        iVar6 = piVar2[iVar12];
        piVar2[iVar12] = piVar2[uVar8];
        piVar2[uVar8] = iVar6;
        while (iVar6 = (int)uVar8, iVar6 != iVar12) {
          s->thfront[iVar6] = iVar11;
          uVar8 = (ulong)(uint)piVar14[iVar6];
        }
        uVar8 = (ulong)(uint)s->anc;
      }
      s->kanctar = 0;
      piVar9 = s->anctar;
      iVar11 = s->threp[piVar1[s->lev]];
      s->kanctar = 1;
      *piVar9 = iVar11;
      piVar1 = s->thnext;
      iVar12 = iVar11;
      while (iVar12 = piVar1[iVar12], iVar12 != iVar11) {
        iVar6 = s->kanctar;
        s->kanctar = iVar6 + 1;
        piVar9[iVar6] = iVar12;
      }
      piVar1 = s->thsize;
      iVar11 = s->kanctar;
      uVar8 = 1;
      do {
        uVar13 = (int)uVar8 * 3 + 1;
        uVar8 = (ulong)uVar13;
      } while ((int)uVar13 < iVar11 / 3);
      do {
        iVar6 = (int)uVar8;
        iVar12 = 0;
        for (lVar10 = (long)iVar6; lVar10 < iVar11; lVar10 = lVar10 + 1) {
          iVar7 = piVar9[lVar10];
          iVar5 = iVar12;
          do {
            lVar15 = (long)(iVar6 + iVar5);
            if (piVar1[piVar9[iVar5]] <= piVar1[iVar7]) break;
            piVar9[iVar6 + iVar5] = piVar9[iVar5];
            bVar4 = iVar6 <= iVar5;
            lVar15 = (long)iVar5;
            iVar5 = iVar5 - iVar6;
          } while (bVar4);
          piVar9[lVar15] = iVar7;
          iVar12 = iVar12 + 1;
        }
        uVar8 = uVar8 / 3;
      } while (2 < iVar6);
      iVar11 = s->lev;
      iVar12 = s->anc;
    }
    if (iVar11 == iVar12) {
      iVar11 = find_representative(s->indmin,s->theta);
      iVar11 = s->thsize[iVar11];
      pick_all_the_pairs(s);
      clear_undiffnons(s);
      s->ndiffnons = 0;
      s->npairs = 0;
      s->nundiffs = 0;
      s->ndiffs = 0;
      iVar6 = s->start[s->lev];
      if (iVar11 != (s->right).clen[iVar6] + 1) {
        iVar12 = find_representative(s->indmin,s->theta);
        do {
          iVar7 = s->kanctar;
          if ((long)iVar7 == 0) goto LAB_002760f4;
          s->kanctar = iVar7 + -1;
          iVar7 = s->anctar[(long)iVar7 + -1];
          iVar5 = find_representative(iVar7,s->theta);
        } while ((iVar5 != iVar7) || (iVar5 == iVar12));
        iVar6 = (s->right).unlab[iVar7] - iVar6;
        if (iVar6 != -1) break;
      }
LAB_002760f4:
      psVar3 = s->stats;
      dVar16 = (double)iVar11 * psVar3->grpsize_base;
      psVar3->grpsize_base = dVar16;
      iVar7 = -1;
      if (10000000000.0 < dVar16) {
        psVar3->grpsize_base = dVar16 / 10000000000.0;
        psVar3->grpsize_exp = psVar3->grpsize_exp + 10;
        iVar7 = -1;
      }
    }
    else {
      iVar12 = s->start[iVar11];
      lVar15 = (long)iVar12;
      iVar6 = (s->right).clen[lVar15];
      lVar10 = iVar6 + lVar15;
      iVar11 = s->specmin[iVar11];
      pick_all_the_pairs(s);
      clear_undiffnons(s);
      s->ndiffnons = -1;
      s->npairs = -1;
      piVar1 = (s->right).lab;
      if (piVar1[lVar10] == iVar11) {
        piVar14 = piVar1 + lVar15 + 1;
        piVar9 = piVar1 + lVar15;
        for (lVar10 = (long)(s->right).clen[lVar15] << 2; lVar10 != 0; lVar10 = lVar10 + -4) {
          piVar2 = piVar14;
          if (*piVar9 <= *piVar14) {
            piVar2 = piVar9;
          }
          piVar9 = piVar2;
          piVar14 = piVar14 + 1;
        }
        iVar7 = (int)((ulong)((long)piVar9 - (long)(piVar1 + lVar15)) >> 2);
        if (iVar6 == iVar7) {
LAB_002761ff:
          iVar7 = orbit_prune(s);
        }
      }
      else {
        iVar6 = orbit_prune(s);
        iVar7 = -1;
        if (iVar6 != -1) {
          iVar12 = iVar12 + iVar6;
          if (piVar1[iVar12] == iVar11) {
            swap_labels(&s->right,iVar12,(int)lVar10);
            goto LAB_002761ff;
          }
          break;
        }
      }
    }
    iVar6 = iVar7;
  } while (iVar6 == -1);
  return iVar6 + s->start[s->lev];
}

Assistant:

static int
backtrack_loop(struct saucy *s)
{
    int min;

    /* Backtrack as long as we're exhausting target cells */
    for (--s->lev; s->lev; --s->lev) {
        min = do_backtrack(s);
        if (min != -1) return min + s->start[s->lev];
    }
    return -1;
}